

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DArray.hpp
# Opt level: O2

bool __thiscall
Lib::DArray<Indexing::CodeTree::LitInfo>::ensure(DArray<Indexing::CodeTree::LitInfo> *this,size_t s)

{
  ulong uVar1;
  LitInfo *pLVar2;
  ulong uVar3;
  
  uVar1 = this->_capacity;
  if (uVar1 < s) {
    uVar3 = uVar1 * 2;
    if (uVar1 * 2 <= s) {
      uVar3 = s;
    }
    pLVar2 = (LitInfo *)Lib::alloc(uVar3 * 0x18);
    if (this->_array != (LitInfo *)0x0) {
      Lib::free(this->_array);
    }
    this->_size = s;
    this->_capacity = uVar3;
    this->_array = pLVar2;
  }
  else {
    this->_size = s;
  }
  return s <= uVar1;
}

Assistant:

inline bool ensure(size_t s)
  {
    if (_capacity >= s) {
      _size = s;
      return true;
    }

    size_t newCapacity = std::max(s, _capacity*2);

    void* mem = ALLOC_KNOWN(sizeof(C)*newCapacity,"DArray<>");
    C* newArray=array_new<C>(mem, newCapacity);

    if(_array) {
      array_delete(_array, _capacity);
      DEALLOC_KNOWN(_array,sizeof(C)*_capacity,"DArray<>");
    }
    _size = s;
    _capacity = newCapacity;
    _array = newArray;
    return false;
  }